

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O2

SerializedData * __thiscall
Diligent::DeviceObjectArchive::GetSerializedShader
          (DeviceObjectArchive *this,DeviceType Type,size_t Idx)

{
  pointer pSVar1;
  int iVar2;
  SerializedData *pSVar3;
  
  pSVar1 = (this->m_DeviceShaders)._M_elems[Type].
           super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (Idx < (ulong)((long)(this->m_DeviceShaders)._M_elems[Type].
                          super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5)) {
    pSVar3 = pSVar1 + Idx;
  }
  else {
    pSVar3 = &GetSerializedShader::NullData;
    if (GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)::NullData ==
        '\0') {
      iVar2 = __cxa_guard_acquire(&GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)
                                   ::NullData);
      if (iVar2 != 0) {
        GetSerializedShader::NullData.m_Size = 0;
        GetSerializedShader::NullData.m_Hash.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)0;
        GetSerializedShader::NullData.m_pAllocator = (IMemoryAllocator *)0x0;
        GetSerializedShader::NullData.m_Ptr = (void *)0x0;
        pSVar3 = &GetSerializedShader::NullData;
        __cxa_atexit(SerializedData::~SerializedData,&GetSerializedShader::NullData,&__dso_handle);
        __cxa_guard_release(&GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)
                             ::NullData);
      }
    }
  }
  return pSVar3;
}

Assistant:

const auto& GetSerializedShader(DeviceType Type, size_t Idx) const noexcept
    {
        const auto& DeviceShaders = m_DeviceShaders[static_cast<size_t>(Type)];
        if (Idx < DeviceShaders.size())
            return DeviceShaders[Idx];

        static const SerializedData NullData;
        return NullData;
    }